

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandFraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  char *pcVar5;
  ABC_INT64_T *local_110;
  int fPartition;
  int c;
  int fExdc;
  int fAllNodes;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  Fraig_Params_t *pParams;
  Fraig_Params_t Params;
  char Buffer [100];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  pAVar4 = Abc_FrameReadNtk(pAbc);
  fPartition = 0;
  c = 0;
  memset(&pParams,0,0x40);
  pParams._0_4_ = 0x800;
  pParams._4_4_ = 0x800;
  Params.nPatsRand = 100;
  Params.nBTLimit = 1;
  Params.nSeconds = 1;
  Params.fFuncRed = 1;
  Params.fFeedBack = 1;
  Params.fDist1Pats = 0;
  Params.fDoSparse = 0;
  Params.fChoicing = 0;
  Params.fTryProve = 0;
  Extra_UtilGetoptReset();
LAB_0023cf05:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"RDCrscptvaeh");
    if (iVar2 == -1) {
      if (pAVar4 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar2 = Abc_NtkIsLogic(pAVar4);
      if ((iVar2 == 0) && (iVar2 = Abc_NtkIsStrash(pAVar4), iVar2 == 0)) {
        Abc_Print(-1,"Can only fraig a logic network or an AIG.\n");
        return 1;
      }
      Params.fTryProve = Params.fDoSparse;
      if (bVar1) {
        _fExdc = Abc_NtkDup(pAVar4);
        iVar2 = Abc_NtkIsStrash(pAVar4);
        if (iVar2 == 0) {
          pAVar4 = Abc_NtkStrash(pAVar4,c,(uint)((c != 0 ^ 0xffU) & 1),0);
          Abc_NtkFraigPartitionedTime(pAVar4,&pParams);
          Abc_NtkDelete(pAVar4);
        }
        else {
          Abc_NtkFraigPartitionedTime(pAVar4,&pParams);
        }
      }
      else {
        iVar2 = Abc_NtkIsStrash(pAVar4);
        if (iVar2 == 0) {
          pAVar4 = Abc_NtkStrash(pAVar4,c,(uint)((c != 0 ^ 0xffU) & 1),0);
          _fExdc = Abc_NtkFraig(pAVar4,&pParams,c,fPartition);
          Abc_NtkDelete(pAVar4);
        }
        else {
          _fExdc = Abc_NtkFraig(pAVar4,&pParams,c,fPartition);
        }
      }
      if (_fExdc == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Fraiging has failed.\n");
        return 1;
      }
      if (Params.fDoSparse != 0) {
        Abc_NtkMiterReport(_fExdc);
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,_fExdc);
      return 0;
    }
    switch(iVar2) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0023d360;
      }
      Params.nPatsRand = atoi(argv[globalUtilOptind]);
      uVar3 = Params.nPatsRand;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_0023d360;
      }
      pParams._4_4_ = atoi(argv[globalUtilOptind]);
      uVar3 = pParams._4_4_;
      break;
    default:
      goto LAB_0023d360;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_0023d360;
      }
      pParams._0_4_ = atoi(argv[globalUtilOptind]);
      uVar3 = (uint)pParams;
      break;
    case 0x61:
      c = c ^ 1;
      goto LAB_0023cf05;
    case 99:
      Params.fDist1Pats = Params.fDist1Pats ^ 1;
      goto LAB_0023cf05;
    case 0x65:
      fPartition = fPartition ^ 1;
      goto LAB_0023cf05;
    case 0x68:
      goto LAB_0023d360;
    case 0x70:
      Params.fDoSparse = Params.fDoSparse ^ 1;
      goto LAB_0023cf05;
    case 0x72:
      Params.nBTLimit = Params.nBTLimit ^ 1;
      goto LAB_0023cf05;
    case 0x73:
      Params.fFeedBack = Params.fFeedBack ^ 1;
      goto LAB_0023cf05;
    case 0x74:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0023cf05;
    case 0x76:
      Params.fChoicing = Params.fChoicing ^ 1;
      goto LAB_0023cf05;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar3 < 0) {
LAB_0023d360:
      sprintf((char *)&Params.nInspLimit,"%d",(ulong)(uint)Params.nPatsRand);
      Abc_Print(-2,"usage: fraig [-R num] [-D num] [-C num] [-rscpvtah]\n");
      Abc_Print(-2,"\t         transforms a logic network into a functionally reduced AIG\n");
      Abc_Print(-2,"\t         (known bugs: takes an UNSAT miter and returns a SAT one)\n");
      Abc_Print(-2,"\t         (there are newer fraiging commands, \"ifraig\" and \"dfraig\")\n");
      Abc_Print(-2,"\t-R num : number of random patterns (127 < num < 32769) [default = %d]\n",
                (ulong)(uint)pParams);
      Abc_Print(-2,"\t-D num : number of systematic patterns (127 < num < 32769) [default = %d]\n",
                (ulong)pParams._4_4_);
      if (Params.nPatsRand == -1) {
        local_110 = (ABC_INT64_T *)0xb40271;
      }
      else {
        local_110 = &Params.nInspLimit;
      }
      Abc_Print(-2,"\t-C num : number of backtracks for one SAT problem [default = %s]\n",local_110)
      ;
      pcVar5 = "no";
      if (Params.nBTLimit != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle functional reduction [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (Params.fFeedBack != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle considering sparse functions [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (Params.fDist1Pats != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle accumulation of choices [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (Params.fDoSparse != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-p     : toggle proving the miter outputs [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (Params.fChoicing != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (fPartition != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-e     : toggle functional sweeping using EXDC [default = %s]\n",pcVar5);
      pcVar5 = "dfs";
      if (c != 0) {
        pcVar5 = "all";
      }
      Abc_Print(-2,"\t-a     : toggle between all nodes and DFS nodes [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle using partitioned representation [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandFraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[100];
    Fraig_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fAllNodes;
    int fExdc;
    int c;
    int fPartition = 0;
    extern void Abc_NtkFraigPartitionedTime( Abc_Ntk_t * pNtk, void * pParams );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fExdc     = 0;
    fAllNodes = 0;
    memset( pParams, 0, sizeof(Fraig_Params_t) );
    pParams->nPatsRand  = 2048; // the number of words of random simulation info
    pParams->nPatsDyna  = 2048; // the number of words of dynamic simulation info
    pParams->nBTLimit   =  100; // the max number of backtracks to perform
    pParams->fFuncRed   =    1; // performs only one level hashing
    pParams->fFeedBack  =    1; // enables solver feedback
    pParams->fDist1Pats =    1; // enables distance-1 patterns
    pParams->fDoSparse  =    1; // performs equiv tests for sparse functions
    pParams->fChoicing  =    0; // enables recording structural choices
    pParams->fTryProve  =    0; // tries to solve the final miter
    pParams->fVerbose   =    0; // the verbosiness flag
    pParams->fVerboseP  =    0; // the verbosiness flag
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "RDCrscptvaeh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nPatsRand = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nPatsRand < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nPatsDyna = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nPatsDyna < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nBTLimit < 0 )
                goto usage;
            break;

        case 'r':
            pParams->fFuncRed ^= 1;
            break;
        case 's':
            pParams->fDoSparse ^= 1;
            break;
        case 'c':
            pParams->fChoicing ^= 1;
            break;
        case 'p':
            pParams->fTryProve ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 't':
            fPartition ^= 1;
            break;
        case 'a':
            fAllNodes ^= 1;
            break;
        case 'e':
            fExdc ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only fraig a logic network or an AIG.\n" );
        return 1;
    }

    // report the proof
    pParams->fVerboseP = pParams->fTryProve;

    // get the new network
    if ( fPartition )
    {
        pNtkRes = Abc_NtkDup( pNtk );
        if ( Abc_NtkIsStrash(pNtk) )
            Abc_NtkFraigPartitionedTime( pNtk, &Params );
        else
        {
            pNtk = Abc_NtkStrash( pNtk, fAllNodes, !fAllNodes, 0 );
            Abc_NtkFraigPartitionedTime( pNtk, &Params );
            Abc_NtkDelete( pNtk );
        }
    }
    else
    {
        if ( Abc_NtkIsStrash(pNtk) )
            pNtkRes = Abc_NtkFraig( pNtk, &Params, fAllNodes, fExdc );
        else
        {
            pNtk = Abc_NtkStrash( pNtk, fAllNodes, !fAllNodes, 0 );
            pNtkRes = Abc_NtkFraig( pNtk, &Params, fAllNodes, fExdc );
            Abc_NtkDelete( pNtk );
        }
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Fraiging has failed.\n" );
        return 1;
    }

    if ( pParams->fTryProve ) // report the result
        Abc_NtkMiterReport( pNtkRes );

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    sprintf(Buffer, "%d", pParams->nBTLimit );
    Abc_Print( -2, "usage: fraig [-R num] [-D num] [-C num] [-rscpvtah]\n" );
    Abc_Print( -2, "\t         transforms a logic network into a functionally reduced AIG\n" );
    Abc_Print( -2, "\t         (known bugs: takes an UNSAT miter and returns a SAT one)\n");
    Abc_Print( -2, "\t         (there are newer fraiging commands, \"ifraig\" and \"dfraig\")\n" );
    Abc_Print( -2, "\t-R num : number of random patterns (127 < num < 32769) [default = %d]\n",     pParams->nPatsRand );
    Abc_Print( -2, "\t-D num : number of systematic patterns (127 < num < 32769) [default = %d]\n", pParams->nPatsDyna );
    Abc_Print( -2, "\t-C num : number of backtracks for one SAT problem [default = %s]\n",    pParams->nBTLimit==-1? "infinity" : Buffer );
    Abc_Print( -2, "\t-r     : toggle functional reduction [default = %s]\n",                 pParams->fFuncRed? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle considering sparse functions [default = %s]\n",         pParams->fDoSparse? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle accumulation of choices [default = %s]\n",              pParams->fChoicing? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle proving the miter outputs [default = %s]\n",              pParams->fTryProve? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n",                       pParams->fVerbose?  "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle functional sweeping using EXDC [default = %s]\n",       fExdc? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle between all nodes and DFS nodes [default = %s]\n",      fAllNodes? "all": "dfs" );
    Abc_Print( -2, "\t-t     : toggle using partitioned representation [default = %s]\n",     fPartition? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}